

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O3

StructValues<wasm::(anonymous_namespace)::FieldInfo> * __thiscall
wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
          (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *this,HeapType type)

{
  __node_base *p_Var1;
  size_type *psVar2;
  void *pvVar3;
  __node_base_ptr p_Var4;
  __buckets_ptr pp_Var5;
  FieldInfo *pFVar6;
  FieldInfo *pFVar7;
  HeapType HVar8;
  bool bVar9;
  pointer pFVar10;
  _Hash_node_base *p_Var11;
  _Hash_node_base *p_Var12;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var13;
  Struct *pSVar14;
  pointer pFVar15;
  ulong uVar16;
  size_type __n;
  ulong uVar17;
  FieldInfo *pFVar18;
  long lVar19;
  void *pvVar20;
  _Hash_node_base _Var21;
  __node_ptr __n_00;
  ulong uVar22;
  _Hash_node_base *p_Var23;
  _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
  *this_00;
  undefined1 auVar24 [16];
  _Hash_node_base local_50;
  HeapType type_local;
  new_allocator<std::__detail::_Hash_node_base_*> local_31 [8];
  __buckets_alloc_type __alloc;
  
  local_50._M_nxt = (_Hash_node_base *)type.id;
  bVar9 = HeapType::isStruct((HeapType *)&local_50);
  _Var21._M_nxt = local_50._M_nxt;
  if (!bVar9) {
    __assert_fail("type.isStruct()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                  ,0x35,
                  "StructValues<T> &wasm::StructUtils::StructValuesMap<wasm::(anonymous namespace)::FieldInfo>::operator[](HeapType) [T = wasm::(anonymous namespace)::FieldInfo]"
                 );
  }
  pFVar10 = std::
            _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
            ::_M_allocate((_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                           *)0x0,type.id);
  p_Var11 = (_Hash_node_base *)operator_new(0x30);
  p_Var11->_M_nxt = (_Hash_node_base *)0x0;
  p_Var11[1]._M_nxt = _Var21._M_nxt;
  p_Var11[2]._M_nxt = (_Hash_node_base *)pFVar10;
  p_Var11[3]._M_nxt = (_Hash_node_base *)pFVar10;
  p_Var11[4]._M_nxt = (_Hash_node_base *)pFVar10;
  type_local.id = (uintptr_t)p_Var11;
  p_Var12 = (_Hash_node_base *)
            std::hash<wasm::HeapType>::operator()
                      ((hash<wasm::HeapType> *)this,(HeapType *)(p_Var11 + 1));
  __n_00 = (__node_ptr)
           (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           )._M_h._M_bucket_count;
  uVar16 = (ulong)p_Var12 % (ulong)__n_00;
  p_Var4 = (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           )._M_h._M_buckets[uVar16];
  if (p_Var4 == (__node_base_ptr)0x0) {
LAB_0070d913:
    auVar24 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->
                                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                                 )._M_h._M_rehash_policy,(ulong)__n_00,
                         (this->
                         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                         )._M_h._M_element_count);
    __n = auVar24._8_8_;
    if ((auVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (this->
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            )._M_h._M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &(this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               )._M_h._M_single_bucket;
        (this->
        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
        )._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (local_31,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      __n_00 = (__node_ptr)
               (this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               )._M_h._M_before_begin._M_nxt;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (__n_00 != (__node_ptr)0x0) {
        p_Var1 = &(this->
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  )._M_h._M_before_begin;
        _Var21._M_nxt = (_Hash_node_base *)__n_00;
        uVar16 = 0;
        do {
          __n_00 = (__node_ptr)((_Hash_node_base *)&(_Var21._M_nxt)->_M_nxt)->_M_nxt;
          uVar17 = ((_Hash_node_code_cache<true> *)(_Var21._M_nxt + 5))->_M_hash_code % __n;
          if (__s[uVar17] == (_Hash_node_base *)0x0) {
            ((_Hash_node_base *)&(_Var21._M_nxt)->_M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var21._M_nxt;
            __s[uVar17] = p_Var1;
            if (((_Hash_node_base *)&(_Var21._M_nxt)->_M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var13 = __s + uVar16;
              goto LAB_0070d9c2;
            }
          }
          else {
            ((_Hash_node_base *)&(_Var21._M_nxt)->_M_nxt)->_M_nxt = __s[uVar17]->_M_nxt;
            pp_Var13 = &__s[uVar17]->_M_nxt;
            uVar17 = uVar16;
LAB_0070d9c2:
            *pp_Var13 = _Var21._M_nxt;
          }
          _Var21._M_nxt = (_Hash_node_base *)__n_00;
          uVar16 = uVar17;
        } while (__n_00 != (__node_ptr)0x0);
      }
      pp_Var5 = (this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                )._M_h._M_buckets;
      if (&(this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           )._M_h._M_single_bucket != pp_Var5) {
        __n_00 = (__node_ptr)
                 ((this->
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  )._M_h._M_bucket_count << 3);
        operator_delete(pp_Var5,(ulong)__n_00);
      }
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      )._M_h._M_bucket_count = __n;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      )._M_h._M_buckets = __s;
      uVar16 = (ulong)p_Var12 % __n;
    }
    HVar8.id = type_local.id;
    *(_Hash_node_base **)(type_local.id + 0x28) = p_Var12;
    if (__s[uVar16] == (_Hash_node_base *)0x0) {
      p_Var12 = (this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                )._M_h._M_before_begin._M_nxt;
      *(_Hash_node_base **)type_local.id = p_Var12;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)type_local.id;
      if (p_Var12 != (_Hash_node_base *)0x0) {
        __s[(ulong)p_Var12[5]._M_nxt %
            (this->
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            )._M_h._M_bucket_count] = (__node_base_ptr)type_local.id;
        __s = (this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              )._M_h._M_buckets;
      }
      __s[uVar16] = &(this->
                     super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                     )._M_h._M_before_begin;
    }
    else {
      *(_Hash_node_base **)type_local.id = __s[uVar16]->_M_nxt;
      __s[uVar16]->_M_nxt = (_Hash_node_base *)type_local.id;
    }
    psVar2 = &(this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              )._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    pSVar14 = HeapType::getStruct((HeapType *)&local_50);
    uVar17 = (long)(pSVar14->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar14->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    pvVar20 = *(void **)(HVar8.id + 0x18);
    lVar19 = (long)pvVar20 - *(long *)(HVar8.id + 0x10);
    uVar16 = lVar19 >> 1;
    uVar22 = uVar17 - uVar16;
    if (uVar17 < uVar16 || uVar22 == 0) {
      if ((uVar17 < uVar16) &&
         (pvVar3 = (void *)(*(long *)(HVar8.id + 0x10) + uVar17 * 2), pvVar20 != pvVar3)) {
        *(void **)(type_local.id + 0x18) = pvVar3;
      }
    }
    else if ((ulong)(*(long *)(HVar8.id + 0x20) - (long)pvVar20 >> 1) < uVar22) {
      if ((uVar16 ^ 0x3fffffffffffffff) < uVar22) {
        std::__throw_length_error("vector::_M_default_append");
      }
      uVar17 = uVar22;
      if (uVar22 < uVar16) {
        uVar17 = uVar16;
      }
      this_00 = (_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                 *)(uVar17 + uVar16);
      if ((_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
           *)0x3ffffffffffffffe < this_00) {
        this_00 = (_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                   *)0x3fffffffffffffff;
      }
      pFVar15 = std::
                _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                ::_M_allocate(this_00,(size_t)__n_00);
      pvVar20 = (void *)(lVar19 + (long)pFVar15);
      memset(pvVar20,0,uVar22 * 2);
      HVar8 = type_local;
      pFVar7 = *(FieldInfo **)(type_local.id + 0x18);
      pFVar6 = *(FieldInfo **)(type_local.id + 0x10);
      pFVar10 = pFVar15;
      for (pFVar18 = pFVar6; pFVar18 != pFVar7; pFVar18 = pFVar18 + 1) {
        *pFVar10 = *pFVar18;
        pFVar10 = pFVar10 + 1;
      }
      if (pFVar6 != (FieldInfo *)0x0) {
        operator_delete(pFVar6,*(long *)(type_local.id + 0x20) - (long)pFVar6);
      }
      *(pointer *)(HVar8.id + 0x10) = pFVar15;
      *(void **)(HVar8.id + 0x18) = (void *)((long)pvVar20 + uVar22 * 2);
      *(pointer *)(HVar8.id + 0x20) = pFVar15 + (long)this_00;
    }
    else {
      memset(pvVar20,0,uVar22 * 2);
      *(void **)(HVar8.id + 0x18) = (void *)((long)pvVar20 + uVar22 * 2);
    }
  }
  else {
    p_Var23 = p_Var4->_M_nxt;
    if (p_Var23[5]._M_nxt == p_Var12) goto LAB_0070d8f8;
    do {
      do {
        p_Var23 = p_Var23->_M_nxt;
        if ((p_Var23 == (_Hash_node_base *)0x0) ||
           ((ulong)p_Var23[5]._M_nxt % (ulong)__n_00 != uVar16)) goto LAB_0070d913;
      } while (p_Var23[5]._M_nxt != p_Var12);
LAB_0070d8f8:
    } while (p_Var23[1]._M_nxt != p_Var11[1]._M_nxt);
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
    ::_M_deallocate_node
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
                *)type_local.id,__n_00);
    p_Var11 = p_Var23;
  }
  return (StructValues<wasm::(anonymous_namespace)::FieldInfo> *)(p_Var11 + 2);
}

Assistant:

StructValues<T>& operator[](HeapType type) {
    assert(type.isStruct());
    auto inserted = this->insert({type, {}});
    auto& values = inserted.first->second;
    if (inserted.second) {
      values.resize(type.getStruct().fields.size());
    }
    return values;
  }